

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O0

void __thiscall henson::Puppet::load(Puppet *this,ProcMap *procmap,NameMap *namemap)

{
  undefined8 uVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _func_int_int_char_ptr_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  _func_void_void_ptr *p_Var4;
  _func_void_int_ptr *p_Var5;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  runtime_error *e;
  undefined1 in_stack_00000090 [16];
  string_view in_stack_000000a0;
  void *lib;
  char **in_stack_fffffffffffffe40;
  undefined8 local_170;
  char *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  Puppet *in_stack_fffffffffffffea8;
  char *pcVar6;
  string local_148 [32];
  long local_128;
  void *local_120;
  void *local_118;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined8 *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [16];
  string *local_a8;
  char *local_a0;
  undefined1 *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  char *local_10;
  
  local_120 = in_RDX;
  local_118 = in_RSI;
  uVar1 = std::__cxx11::string::c_str();
  local_128 = dlopen(uVar1,1);
  *(long *)(in_RDI + 0xb8) = local_128;
  if (local_128 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_98 = &stack0xfffffffffffffea8;
    local_a0 = "Could not load {}\n{}\n";
    local_90 = "Could not load {}\n{}\n";
    pcVar6 = "Could not load {}\n{}\n";
    local_88 = local_98;
    std::char_traits<char>::length((char_type *)0x2e3018);
    local_10 = local_a0;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x70);
    local_170 = dlerror();
    local_a8 = local_148;
    local_c8 = &local_170;
    local_60 = local_b8;
    local_d8 = pcVar6;
    local_c0 = args;
    local_58 = pcVar6;
    ::fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&,char*&>
              (args,in_stack_fffffffffffffe40);
    local_38 = &local_e8;
    local_40 = local_108;
    local_28 = 0xcd;
    local_e8 = 0xcd;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    local_e0 = local_40;
    ::fmt::v8::vformat_abi_cxx11_(in_stack_000000a0,(format_args)in_stack_00000090);
    std::runtime_error::runtime_error(this_00,local_148);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var2 = __henson__Puppet__get_function<int(*)(int,char**)>_void__char_const___
                     (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  *(_func_int_int_char_ptr_ptr **)(in_RDI + 0xb0) = p_Var2;
  p_Var3 = __henson__Puppet__get_function<void(*)(void*,void*)>_void__char_const___
                     (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  (*p_Var3)((void *)(in_RDI + 0x50),(void *)(in_RDI + 0x58));
  p_Var4 = __henson__Puppet__get_function<void(*)(void*)>_void__char_const___
                     (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  (*p_Var4)(local_118);
  p_Var5 = __henson__Puppet__get_function<void(*)(int*)>_void__char_const___
                     (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  (*p_Var5)((int *)(in_RDI + 0x24));
  p_Var4 = __henson__Puppet__get_function<void(*)(void*)>_void__char_const___
                     (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  (*p_Var4)(local_120);
  return;
}

Assistant:

void                load(ProcMap* procmap, NameMap* namemap)
                        {
                            void* lib = dlopen(filename_.c_str(), RTLD_LAZY);
                            lib_ = lib;
                            if (lib == NULL)
                                throw std::runtime_error(fmt::format("Could not load {}\n{}\n", filename_, dlerror()));

                            main_ = get_function<MainType>(lib, "main");

                            get_function<SetContextType>(lib, "henson_set_contexts")(&from_, &to_);
                            get_function<SetProcMapType>(lib, "henson_set_procmap")(procmap);
                            get_function<SetStopType>   (lib, "henson_set_stop")(&stop_);

                            try
                            {
                                get_function<SetNameMapType>(lib, "henson_set_namemap")(namemap);
                            } catch(std::runtime_error& e)
                            {
                                // it's a weird situation, but possible if the puppet doesn't need to get any data in or out
                                // (the linker may choose not to pull src/data.cpp and so henson_set_namemap will be missing)
                                log_->warn("{} | Reasonable only if {} doesn't need to exchange any data", e.what(), filename_);
                            }
                        }